

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.h
# Opt level: O3

void __thiscall aiAnimation::~aiAnimation(aiAnimation *this)

{
  aiNodeAnim *this_00;
  aiMeshAnim *paVar1;
  aiMeshMorphAnim *this_01;
  uint a;
  ulong uVar2;
  
  if ((this->mNumChannels != 0) && (this->mChannels != (aiNodeAnim **)0x0)) {
    uVar2 = 0;
    do {
      this_00 = this->mChannels[uVar2];
      if (this_00 != (aiNodeAnim *)0x0) {
        aiNodeAnim::~aiNodeAnim(this_00);
      }
      operator_delete(this_00,0x438);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->mNumChannels);
    if (this->mChannels != (aiNodeAnim **)0x0) {
      operator_delete__(this->mChannels);
    }
  }
  if ((this->mNumMeshChannels != 0) && (this->mMeshChannels != (aiMeshAnim **)0x0)) {
    uVar2 = 0;
    do {
      paVar1 = this->mMeshChannels[uVar2];
      if ((paVar1 != (aiMeshAnim *)0x0) && (*(void **)(paVar1 + 0x408) != (void *)0x0)) {
        operator_delete__(*(void **)(paVar1 + 0x408));
      }
      operator_delete(paVar1,0x410);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->mNumMeshChannels);
    if (this->mMeshChannels != (aiMeshAnim **)0x0) {
      operator_delete__(this->mMeshChannels);
    }
  }
  if ((this->mNumMorphMeshChannels != 0) && (this->mMorphMeshChannels != (aiMeshMorphAnim **)0x0)) {
    uVar2 = 0;
    do {
      this_01 = this->mMorphMeshChannels[uVar2];
      if (this_01 != (aiMeshMorphAnim *)0x0) {
        aiMeshMorphAnim::~aiMeshMorphAnim(this_01);
      }
      operator_delete(this_01,0x410);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->mNumMorphMeshChannels);
    if (this->mMorphMeshChannels != (aiMeshMorphAnim **)0x0) {
      operator_delete__(this->mMorphMeshChannels);
      return;
    }
  }
  return;
}

Assistant:

~aiAnimation() {
        // DO NOT REMOVE THIS ADDITIONAL CHECK
        if ( mNumChannels && mChannels )  {
            for( unsigned int a = 0; a < mNumChannels; a++) {
                delete mChannels[ a ];
            }

            delete [] mChannels;
        }
        if (mNumMeshChannels && mMeshChannels)  {
            for( unsigned int a = 0; a < mNumMeshChannels; a++) {
                delete mMeshChannels[a];
            }

            delete [] mMeshChannels;
        }
        if (mNumMorphMeshChannels && mMorphMeshChannels) {
                for( unsigned int a = 0; a < mNumMorphMeshChannels; a++) {
                        delete mMorphMeshChannels[a];
                }
            
            delete [] mMorphMeshChannels;
        }
    }